

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg.h
# Opt level: O3

void __thiscall
ocmesh::details::transform_t::transform_t
          (transform_t *this,scene *scene,object *child,mat4 *object_to_world)

{
  anon_union_4_3_4e90b0ec_for_tvec4<float,_(glm::precision)0>_4 aVar1;
  anon_union_4_3_4e909dac_for_tvec4<float,_(glm::precision)0>_6 aVar2;
  anon_union_4_3_4e909a07_for_tvec4<float,_(glm::precision)0>_8 aVar3;
  anon_union_4_3_4e90da17_for_tvec4<float,_(glm::precision)0>_2 aVar4;
  anon_union_4_3_4e90b0ec_for_tvec4<float,_(glm::precision)0>_4 aVar5;
  anon_union_4_3_4e909dac_for_tvec4<float,_(glm::precision)0>_6 aVar6;
  anon_union_4_3_4e909a07_for_tvec4<float,_(glm::precision)0>_8 aVar7;
  anon_union_4_3_4e90da17_for_tvec4<float,_(glm::precision)0>_2 aVar8;
  anon_union_4_3_4e90b0ec_for_tvec4<float,_(glm::precision)0>_4 aVar9;
  anon_union_4_3_4e909dac_for_tvec4<float,_(glm::precision)0>_6 aVar10;
  anon_union_4_3_4e909a07_for_tvec4<float,_(glm::precision)0>_8 aVar11;
  anon_union_4_3_4e90da17_for_tvec4<float,_(glm::precision)0>_2 aVar12;
  anon_union_4_3_4e90b0ec_for_tvec4<float,_(glm::precision)0>_4 aVar13;
  anon_union_4_3_4e909dac_for_tvec4<float,_(glm::precision)0>_6 aVar14;
  anon_union_4_3_4e909a07_for_tvec4<float,_(glm::precision)0>_8 aVar15;
  
  (this->super_object)._scene = scene;
  (this->super_object)._vptr_object = (_func_int **)&PTR__binary_operation_t_00113c58;
  this->_child = child;
  aVar1 = object_to_world->value[0].field_1;
  aVar2 = object_to_world->value[0].field_2;
  aVar3 = object_to_world->value[0].field_3;
  aVar4 = object_to_world->value[1].field_0;
  aVar5 = object_to_world->value[1].field_1;
  aVar6 = object_to_world->value[1].field_2;
  aVar7 = object_to_world->value[1].field_3;
  aVar8 = object_to_world->value[2].field_0;
  aVar9 = object_to_world->value[2].field_1;
  aVar10 = object_to_world->value[2].field_2;
  aVar11 = object_to_world->value[2].field_3;
  aVar12 = object_to_world->value[3].field_0;
  aVar13 = object_to_world->value[3].field_1;
  aVar14 = object_to_world->value[3].field_2;
  aVar15 = object_to_world->value[3].field_3;
  (this->_object_to_world).value[0].field_0 = object_to_world->value[0].field_0;
  (this->_object_to_world).value[0].field_1 = aVar1;
  (this->_object_to_world).value[0].field_2 = aVar2;
  (this->_object_to_world).value[0].field_3 = aVar3;
  (this->_object_to_world).value[1].field_0 = aVar4;
  (this->_object_to_world).value[1].field_1 = aVar5;
  (this->_object_to_world).value[1].field_2 = aVar6;
  (this->_object_to_world).value[1].field_3 = aVar7;
  (this->_object_to_world).value[2].field_0 = aVar8;
  (this->_object_to_world).value[2].field_1 = aVar9;
  (this->_object_to_world).value[2].field_2 = aVar10;
  (this->_object_to_world).value[2].field_3 = aVar11;
  (this->_object_to_world).value[3].field_0 = aVar12;
  (this->_object_to_world).value[3].field_1 = aVar13;
  (this->_object_to_world).value[3].field_2 = aVar14;
  (this->_object_to_world).value[3].field_3 = aVar15;
  glm::detail::compute_inverse<float,(glm::precision)0>(object_to_world);
  return;
}

Assistant:

transform_t(class scene *scene,
                    object *child, glm::mat4 const&object_to_world)
        : object(scene), _child(child),
          _object_to_world(object_to_world),
          _world_to_object(glm::inverse(object_to_world)) { }